

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_zip_entry_open(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  jx9_value *pObj;
  char *zMessage;
  jx9_real jVar2;
  
  zMessage = "Expecting a ZIP archive";
  if ((((1 < nArg) && (((*apArg)->iFlags & 0x100) != 0)) && ((apArg[1]->iFlags & 0x100) != 0)) &&
     ((lVar1 = ((*apArg)->x).iVal, lVar1 != 0 && (*(int *)(lVar1 + 0x50) == -0x21529ca6)))) {
    lVar1 = (apArg[1]->x).iVal;
    zMessage = "Expecting a ZIP archive entry";
    if ((lVar1 != 0) && (jVar2 = 4.94065645841247e-324, *(int *)(lVar1 + 0xa0) == -0x21529ca6))
    goto LAB_0013bbf8;
  }
  jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,1,zMessage);
  jVar2 = 0.0;
LAB_0013bbf8:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = jVar2;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_zip_entry_open(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchiveEntry *pEntry;
	SyArchive *pArchive;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) || !jx9_value_is_resource(apArg[1]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the in-memory archive */
	pArchive = (SyArchive *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid ZIP archive */
	if( SXARCH_INVALID(pArchive) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid ZIP archive entry */
	pEntry = (SyArchiveEntry *)jx9_value_to_resource(apArg[1]);
	if( SXARCH_ENTRY_INVALID(pEntry) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* All done. Actually this function is a no-op, return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}